

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadedSocketInitiator.cpp
# Opt level: O0

void __thiscall
FIX::ThreadedSocketInitiator::doConnect(ThreadedSocketInitiator *this,SessionID *s,Dictionary *d)

{
  socket_handle s_00;
  undefined2 port_00;
  undefined8 uVar1;
  Dictionary *sessionID;
  bool bVar2;
  Session *this_00;
  ThreadedSocketConnection *this_01;
  Log *pLog;
  pair<FIX::ThreadedSocketInitiator_*,_FIX::ThreadedSocketConnection_*> *this_02;
  signed_int value;
  signed_int value_00;
  exception *anon_var_0;
  thread_id thread;
  Locker l;
  ThreadPair *pair;
  ThreadedSocketConnection *pConnection;
  string local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  socket_handle local_a8;
  ushort local_a2;
  socket_handle socket;
  short sourcePort;
  string sourceAddress;
  undefined1 local_78 [6];
  short port;
  string address;
  Log *log;
  Session *local_28;
  Session *session;
  Dictionary *d_local;
  SessionID *s_local;
  ThreadedSocketInitiator *this_local;
  
  session = (Session *)d;
  d_local = (Dictionary *)s;
  s_local = (SessionID *)this;
  this_00 = Session::lookupSession(s);
  local_28 = this_00;
  UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&log);
  bVar2 = Session::isSessionTime(this_00,(UtcTimeStamp *)&log);
  UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)&log);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    address.field_2._8_8_ = Session::getLog(local_28);
    std::__cxx11::string::string((string *)local_78);
    sourceAddress.field_2._14_2_ = 0;
    std::__cxx11::string::string((string *)&socket);
    local_a2 = 0;
    getHost(this,(SessionID *)d_local,(Dictionary *)session,(string *)local_78,
            (short *)(sourceAddress.field_2._M_local_buf + 0xe),(string *)&socket,(short *)&local_a2
           );
    local_a8 = socket_createConnector();
    if ((this->m_noDelay & 1U) != 0) {
      socket_setsockopt(local_a8,1);
    }
    if (this->m_sendBufSize != 0) {
      socket_setsockopt(local_a8,7,this->m_sendBufSize);
    }
    if (this->m_rcvBufSize != 0) {
      socket_setsockopt(local_a8,8,this->m_rcvBufSize);
    }
    Initiator::setPending(&this->super_Initiator,(SessionID *)d_local);
    uVar1 = address.field_2._8_8_;
    std::operator+(&local_1a8,"Connecting to ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
    std::operator+(&local_188,&local_1a8," on port ");
    IntConvertor::convert_abi_cxx11_
              (&local_1c8,(IntConvertor *)(ulong)(ushort)sourceAddress.field_2._14_2_,value);
    std::operator+(&local_168,&local_188,&local_1c8);
    std::operator+(&local_148,&local_168," (Source ");
    std::operator+(&local_128,&local_148,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&socket);
    std::operator+(&local_108,&local_128,":");
    IntConvertor::convert_abi_cxx11_
              ((string *)&pConnection,(IntConvertor *)(ulong)local_a2,value_00);
    std::operator+(&local_e8,&local_108,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pConnection
                  );
    std::operator+(&local_c8,&local_e8,")");
    (**(code **)(*(long *)uVar1 + 0x30))(uVar1,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&pConnection);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_188);
    std::__cxx11::string::~string((string *)&local_1a8);
    this_01 = (ThreadedSocketConnection *)operator_new(0x2148);
    sessionID = d_local;
    port_00 = sourceAddress.field_2._14_2_;
    s_00 = local_a8;
    pLog = Initiator::getLog(&this->super_Initiator);
    ThreadedSocketConnection::ThreadedSocketConnection
              (this_01,(SessionID *)sessionID,s_00,(string *)local_78,port_00,pLog,(string *)&socket
               ,local_a2);
    pair = (ThreadPair *)this_01;
    this_02 = (pair<FIX::ThreadedSocketInitiator_*,_FIX::ThreadedSocketConnection_*> *)
              operator_new(0x10);
    l.m_mutex = (Mutex *)this;
    std::pair<FIX::ThreadedSocketInitiator_*,_FIX::ThreadedSocketConnection_*>::
    pair<FIX::ThreadedSocketInitiator_*,_FIX::ThreadedSocketConnection_*&,_true>
              (this_02,(ThreadedSocketInitiator **)&l,(ThreadedSocketConnection **)&pair);
    Locker::Locker((Locker *)&thread,&this->m_mutex);
    bVar2 = thread_spawn(socketThread,this_02,(thread_id *)&anon_var_0);
    if (bVar2) {
      addThread(this,local_a8,(thread_id)anon_var_0);
    }
    else {
      if (this_02 != (pair<FIX::ThreadedSocketInitiator_*,_FIX::ThreadedSocketConnection_*> *)0x0) {
        operator_delete(this_02,0x10);
      }
      (*(code *)*(_Base_ptr *)
                 ((long)&(pair->first->super_Initiator).m_sessions._M_t._M_impl.
                         super__Rb_tree_header._M_header + 8))();
      if (pair != (ThreadPair *)0x0) {
        (**(code **)&(pair->first->super_Initiator).m_sessions._M_t._M_impl)();
      }
      Initiator::setDisconnected(&this->super_Initiator,(SessionID *)d_local);
    }
    Locker::~Locker((Locker *)&thread);
    std::__cxx11::string::~string((string *)&socket);
    std::__cxx11::string::~string((string *)local_78);
  }
  return;
}

Assistant:

void ThreadedSocketInitiator::doConnect( const SessionID& s, const Dictionary& d )
{
  try
  {
    Session* session = Session::lookupSession( s );
    if( !session->isSessionTime(UtcTimeStamp()) ) return;

    Log* log = session->getLog();

    std::string address;
    short port = 0;
    std::string sourceAddress;
    short sourcePort = 0;
    getHost( s, d, address, port, sourceAddress, sourcePort );

    socket_handle socket = socket_createConnector();
    if( m_noDelay )
      socket_setsockopt( socket, TCP_NODELAY );
    if( m_sendBufSize )
      socket_setsockopt( socket, SO_SNDBUF, m_sendBufSize );
    if( m_rcvBufSize )
      socket_setsockopt( socket, SO_RCVBUF, m_rcvBufSize );

    setPending( s );
    log->onEvent( "Connecting to " + address + " on port " + IntConvertor::convert((unsigned short)port) + " (Source " + sourceAddress + ":" + IntConvertor::convert((unsigned short)sourcePort) + ")");

    ThreadedSocketConnection* pConnection =
      new ThreadedSocketConnection( s, socket, address, port, getLog(), sourceAddress, sourcePort );

    ThreadPair* pair = new ThreadPair( this, pConnection );

    {
      Locker l( m_mutex );
      thread_id thread;
      if ( thread_spawn( &socketThread, pair, thread ) )
      {
        addThread( socket, thread );
      }
      else
      {
        delete pair;
        pConnection->disconnect();
        delete pConnection;
        setDisconnected( s );
      }
    }
  }
  catch ( std::exception& ) {}
}